

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UpperTriangularLayerParams::SerializeWithCachedSizes
          (UpperTriangularLayerParams *this,CodedOutputStream *output)

{
  int64 iVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  UpperTriangularLayerParams *this_local;
  
  iVar1 = k(this);
  if (iVar1 != 0) {
    iVar1 = k(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar1,output);
  }
  return;
}

Assistant:

void UpperTriangularLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.UpperTriangularLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 k = 1;
  if (this->k() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->k(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.UpperTriangularLayerParams)
}